

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

char * ps_get_kws(ps_decoder_t *ps,char *name)

{
  int iVar1;
  ps_search_t *search;
  char *pcVar2;
  
  search = ps_find_search(ps,name);
  if (search != (ps_search_t *)0x0) {
    iVar1 = strcmp("kws",search->type);
    if (iVar1 == 0) {
      pcVar2 = kws_search_get_keyphrases(search);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char*
ps_get_kws(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search = ps_find_search(ps, name);
    if (search == NULL)
        return NULL;
    if (0 != strcmp(PS_SEARCH_TYPE_KWS, ps_search_type(search)))
        return NULL;
    return kws_search_get_keyphrases(search);
}